

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgnxk(fitsfile *fptr,char **inclist,int ninc,char **exclist,int nexc,char *card,int *status)

{
  int iVar1;
  ulong uVar2;
  int namelen;
  int exact;
  char keybuf [81];
  char keyname [75];
  int local_11c;
  char *local_118;
  fitsfile *local_110;
  char **local_108;
  ulong local_100;
  ulong local_f8;
  int local_f0;
  int local_ec;
  char local_e8 [96];
  char local_88 [88];
  
  *card = '\0';
  iVar1 = *status;
  if (iVar1 < 1) {
    if (nexc < 1) {
      nexc = 0;
    }
    local_100 = (ulong)(uint)ninc;
    if (ninc < 1) {
      local_100 = 0;
    }
    local_118 = card;
    local_110 = fptr;
    local_108 = inclist;
    while( true ) {
      iVar1 = ffgcrd(local_110,"*",local_e8,status);
      if (0 < iVar1) break;
      ffgknm(local_e8,local_88,&local_f0,status);
      uVar2 = 0;
      while (uVar2 != local_100) {
        local_f8 = uVar2;
        ffcmps(local_108[uVar2],local_88,0,&local_11c,&local_ec);
        if (local_11c != 0) {
          uVar2 = 0;
          do {
            if ((uint)nexc == uVar2) {
              strcat(local_118,local_e8);
              goto LAB_00160bf1;
            }
            ffcmps(exclist[uVar2],local_88,0,&local_11c,&local_ec);
            uVar2 = uVar2 + 1;
          } while (local_11c == 0);
        }
        uVar2 = local_f8 + 1;
      }
    }
LAB_00160bf1:
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgnxk( fitsfile *fptr,     /* I - FITS file pointer              */
            char **inclist,     /* I - list of included keyword names */
            int ninc,           /* I - number of names in inclist     */
            char **exclist,     /* I - list of excluded keyword names */
            int nexc,           /* I - number of names in exclist     */
            char *card,         /* O - first matching keyword         */
            int  *status)       /* IO - error status                  */
/*
    Return the next keyword that matches one of the names in inclist
    but does not match any of the names in exclist.  The search
    goes from the current position to the end of the header, only.
    Wild card characters may be used in the name lists ('*', '?' and '#').
*/
{
    int casesn, match, exact, namelen;
    long ii, jj;
    char keybuf[FLEN_CARD], keyname[FLEN_KEYWORD];

    card[0] = '\0';
    if (*status > 0)
        return(*status);

    casesn = FALSE;

    /* get next card, and return with an error if hit end of header */
    while( ffgcrd(fptr, "*", keybuf, status) <= 0)
    {
        ffgknm(keybuf, keyname, &namelen, status); /* get the keyword name */
        
        /* does keyword match any names in the include list? */
        for (ii = 0; ii < ninc; ii++)
        {
            ffcmps(inclist[ii], keyname, casesn, &match, &exact);
            if (match)
            {
                /* does keyword match any names in the exclusion list? */
                jj = -1;
                while ( ++jj < nexc )
                {
                    ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                    if (match)
                        break;
                }

                if (jj >= nexc)
                {
                    /* not in exclusion list, so return this keyword */
                    strcat(card, keybuf);
                    return(*status);
                }
            }
        }
    }
    return(*status);
}